

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_push_v(DisasContext *s,TCGv_i64 val)

{
  TCGContext *tcg_ctx_00;
  MemOp idx;
  MemOp aflag;
  TCGv_i64 local_38;
  TCGv_i64 new_esp;
  int size;
  MemOp a_ot;
  MemOp d_ot;
  TCGContext *tcg_ctx;
  TCGv_i64 val_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  idx = mo_pushpop(s,s->dflag);
  aflag = mo_stacksize(s);
  local_38 = s->A0;
  tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->A0,tcg_ctx_00->cpu_regs[4],(long)(1 << ((byte)idx & 0x1f)));
  if (s->code64 == 0) {
    if (s->addseg != 0) {
      local_38 = s->tmp4;
      tcg_gen_mov_i64_x86_64(tcg_ctx_00,local_38,s->A0);
    }
    gen_lea_v_seg(s,aflag,s->A0,2,-1);
  }
  gen_op_st_v(s,idx,val,s->A0);
  gen_op_mov_reg_v(s,aflag,4,local_38);
  return;
}

Assistant:

static void gen_push_v(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp d_ot = mo_pushpop(s, s->dflag);
    MemOp a_ot = mo_stacksize(s);
    int size = 1 << d_ot;
    TCGv new_esp = s->A0;

    tcg_gen_subi_tl(tcg_ctx, s->A0, tcg_ctx->cpu_regs[R_ESP], size);

    if (!CODE64(s)) {
        if (s->addseg) {
            new_esp = s->tmp4;
            tcg_gen_mov_tl(tcg_ctx, new_esp, s->A0);
        }
        gen_lea_v_seg(s, a_ot, s->A0, R_SS, -1);
    }

    gen_op_st_v(s, d_ot, val, s->A0);
    gen_op_mov_reg_v(s, a_ot, R_ESP, new_esp);
}